

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_4_channels_with_10_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float *pfVar50;
  long lVar51;
  float fVar52;
  float fVar53;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar50 = horizontal_coefficients + 8;
  do {
    lVar51 = (long)horizontal_contributors->n0;
    fVar12 = pfVar50[-8];
    fVar13 = pfVar50[-7];
    fVar14 = pfVar50[-6];
    fVar15 = pfVar50[-5];
    pfVar2 = decode_buffer + lVar51 * 4;
    fVar16 = pfVar2[1];
    fVar17 = pfVar2[2];
    fVar18 = pfVar2[3];
    pfVar3 = decode_buffer + lVar51 * 4 + 4;
    fVar19 = pfVar3[1];
    fVar20 = pfVar3[2];
    fVar21 = pfVar3[3];
    pfVar4 = decode_buffer + lVar51 * 4 + 8;
    fVar22 = pfVar4[1];
    fVar23 = pfVar4[2];
    fVar24 = pfVar4[3];
    pfVar5 = decode_buffer + lVar51 * 4 + 0xc;
    fVar25 = pfVar5[1];
    fVar26 = pfVar5[2];
    fVar27 = pfVar5[3];
    fVar28 = pfVar50[-4];
    fVar29 = pfVar50[-3];
    fVar30 = pfVar50[-2];
    fVar31 = pfVar50[-1];
    pfVar6 = decode_buffer + lVar51 * 4 + 0x10;
    fVar32 = pfVar6[1];
    fVar33 = pfVar6[2];
    fVar34 = pfVar6[3];
    pfVar7 = decode_buffer + lVar51 * 4 + 0x14;
    fVar35 = pfVar7[1];
    fVar36 = pfVar7[2];
    fVar37 = pfVar7[3];
    pfVar8 = decode_buffer + lVar51 * 4 + 0x18;
    fVar38 = pfVar8[1];
    fVar39 = pfVar8[2];
    fVar40 = pfVar8[3];
    pfVar9 = decode_buffer + lVar51 * 4 + 0x1c;
    fVar41 = pfVar9[1];
    fVar42 = pfVar9[2];
    fVar43 = pfVar9[3];
    fVar52 = (float)*(undefined8 *)pfVar50;
    fVar53 = (float)((ulong)*(undefined8 *)pfVar50 >> 0x20);
    pfVar10 = decode_buffer + lVar51 * 4 + 0x20;
    fVar44 = pfVar10[1];
    fVar45 = pfVar10[2];
    fVar46 = pfVar10[3];
    pfVar11 = decode_buffer + lVar51 * 4 + 0x24;
    fVar47 = pfVar11[1];
    fVar48 = pfVar11[2];
    fVar49 = pfVar11[3];
    *output_buffer =
         fVar53 * *pfVar11 +
         fVar31 * *pfVar9 + fVar29 * *pfVar7 + fVar15 * *pfVar5 + fVar13 * *pfVar3 +
         *pfVar10 * fVar52 +
         fVar30 * *pfVar8 + *pfVar6 * fVar28 + fVar14 * *pfVar4 + *pfVar2 * fVar12;
    output_buffer[1] =
         fVar53 * fVar47 + fVar31 * fVar41 + fVar29 * fVar35 + fVar15 * fVar25 + fVar13 * fVar19 +
         fVar44 * fVar52 + fVar30 * fVar38 + fVar32 * fVar28 + fVar14 * fVar22 + fVar16 * fVar12;
    output_buffer[2] =
         fVar53 * fVar48 + fVar31 * fVar42 + fVar29 * fVar36 + fVar15 * fVar26 + fVar13 * fVar20 +
         fVar45 * fVar52 + fVar30 * fVar39 + fVar33 * fVar28 + fVar14 * fVar23 + fVar17 * fVar12;
    output_buffer[3] =
         fVar53 * fVar49 + fVar31 * fVar43 + fVar29 * fVar37 + fVar15 * fVar27 + fVar13 * fVar21 +
         fVar46 * fVar52 + fVar30 * fVar40 + fVar34 * fVar28 + fVar14 * fVar24 + fVar18 * fVar12;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar50 = pfVar50 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_10_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__2_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}